

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O3

Layer * ncnn::YoloDetectionOutput_layer_creator(void)

{
  YoloDetectionOutput *this;
  
  this = (YoloDetectionOutput *)operator_new(0xd0);
  YoloDetectionOutput::YoloDetectionOutput(this);
  return &this->super_Layer;
}

Assistant:

YoloDetectionOutput::YoloDetectionOutput()
{
    one_blob_only = true;
    support_inplace = true;

    softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

    // set param
    ncnn::ParamDict pd;
    pd.set(0, 0);// axis

    softmax->load_param(pd);
}